

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

Kit_DsdNtk_t * Kit_DsdDecomposeInt(uint *pTruth,int nVars,int nDecMux)

{
  undefined2 uVar1;
  Kit_DsdObj_t **ppKVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar6;
  undefined1 *puVar7;
  short sVar8;
  long lVar9;
  ulong uVar10;
  unsigned_short *pPar;
  uint uVar11;
  uint uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  long lVar17;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x8e1,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
  }
  pNtk = Kit_DsdNtkAlloc(nVars);
  uVar1 = pNtk->nVars;
  pNtk->Root = uVar1 * 2;
  pKVar6 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,nVars);
  auVar5 = _DAT_0093d220;
  ppKVar2 = pNtk->pNodes;
  if (*ppKVar2 == pKVar6) {
    if (0 < nVars) {
      lVar9 = (ulong)(uint)nVars - 1;
      auVar13._8_4_ = (int)lVar9;
      auVar13._0_8_ = lVar9;
      auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
      lVar9 = 0;
      auVar13 = auVar13 ^ _DAT_0093d220;
      auVar16 = _DAT_009b63e0;
      auVar18 = _DAT_009b63f0;
      auVar19 = _DAT_0093e4e0;
      auVar20 = _DAT_0093d210;
      do {
        auVar21 = auVar20 ^ auVar5;
        iVar35 = auVar13._0_4_;
        iVar34 = -(uint)(iVar35 < auVar21._0_4_);
        iVar14 = auVar13._4_4_;
        auVar22._4_4_ = -(uint)(iVar14 < auVar21._4_4_);
        iVar39 = auVar13._8_4_;
        iVar38 = -(uint)(iVar39 < auVar21._8_4_);
        iVar15 = auVar13._12_4_;
        auVar22._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
        auVar31._4_4_ = iVar34;
        auVar31._0_4_ = iVar34;
        auVar31._8_4_ = iVar38;
        auVar31._12_4_ = iVar38;
        auVar40 = pshuflw(in_XMM11,auVar31,0xe8);
        auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar14);
        auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
        auVar24._0_4_ = auVar24._4_4_;
        auVar24._8_4_ = auVar24._12_4_;
        auVar42 = pshuflw(in_XMM12,auVar24,0xe8);
        auVar22._0_4_ = auVar22._4_4_;
        auVar22._8_4_ = auVar22._12_4_;
        auVar41 = pshuflw(auVar40,auVar22,0xe8);
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar21 = (auVar41 | auVar42 & auVar40) ^ auVar21;
        auVar21 = packssdw(auVar21,auVar21);
        sVar8 = (short)lVar9;
        if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(&pKVar6[1].field_0x0 + lVar9) = sVar8;
        }
        auVar22 = auVar24 & auVar31 | auVar22;
        auVar21 = packssdw(auVar22,auVar22);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
        if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
          *(short *)(&pKVar6[1].field_0x2 + lVar9) = sVar8 + 2;
        }
        auVar21 = auVar19 ^ auVar5;
        iVar34 = -(uint)(iVar35 < auVar21._0_4_);
        auVar36._4_4_ = -(uint)(iVar14 < auVar21._4_4_);
        iVar38 = -(uint)(iVar39 < auVar21._8_4_);
        auVar36._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
        auVar23._4_4_ = iVar34;
        auVar23._0_4_ = iVar34;
        auVar23._8_4_ = iVar38;
        auVar23._12_4_ = iVar38;
        auVar30._4_4_ = -(uint)(auVar21._4_4_ == iVar14);
        auVar30._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
        auVar30._0_4_ = auVar30._4_4_;
        auVar30._8_4_ = auVar30._12_4_;
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar21 = auVar30 & auVar23 | auVar36;
        auVar21 = packssdw(auVar21,auVar21);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
        if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(&pKVar6[2].field_0x0 + lVar9) = sVar8 + 4;
        }
        auVar24 = pshufhw(auVar23,auVar23,0x84);
        auVar31 = pshufhw(auVar30,auVar30,0x84);
        auVar22 = pshufhw(auVar24,auVar36,0x84);
        auVar25._8_4_ = 0xffffffff;
        auVar25._0_8_ = 0xffffffffffffffff;
        auVar25._12_4_ = 0xffffffff;
        auVar25 = (auVar22 | auVar31 & auVar24) ^ auVar25;
        auVar24 = packssdw(auVar25,auVar25);
        if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(&pKVar6[2].field_0x2 + lVar9) = sVar8 + 6;
        }
        auVar24 = auVar18 ^ auVar5;
        iVar34 = -(uint)(iVar35 < auVar24._0_4_);
        auVar27._4_4_ = -(uint)(iVar14 < auVar24._4_4_);
        iVar38 = -(uint)(iVar39 < auVar24._8_4_);
        auVar27._12_4_ = -(uint)(iVar15 < auVar24._12_4_);
        auVar32._4_4_ = iVar34;
        auVar32._0_4_ = iVar34;
        auVar32._8_4_ = iVar38;
        auVar32._12_4_ = iVar38;
        auVar21 = pshuflw(auVar21,auVar32,0xe8);
        auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar14);
        auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar15);
        auVar26._0_4_ = auVar26._4_4_;
        auVar26._8_4_ = auVar26._12_4_;
        in_XMM12 = pshuflw(auVar42 & auVar40,auVar26,0xe8);
        in_XMM12 = in_XMM12 & auVar21;
        auVar27._0_4_ = auVar27._4_4_;
        auVar27._8_4_ = auVar27._12_4_;
        auVar21 = pshuflw(auVar21,auVar27,0xe8);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar40 = (auVar21 | in_XMM12) ^ auVar40;
        auVar21 = packssdw(auVar40,auVar40);
        if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(&pKVar6[3].field_0x0 + lVar9) = sVar8 + 8;
        }
        auVar27 = auVar26 & auVar32 | auVar27;
        auVar21 = packssdw(auVar27,auVar27);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar21 = packssdw(auVar21 ^ auVar42,auVar21 ^ auVar42);
        if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)(&pKVar6[3].field_0x2 + lVar9) = sVar8 + 10;
        }
        auVar21 = auVar16 ^ auVar5;
        iVar35 = -(uint)(iVar35 < auVar21._0_4_);
        auVar37._4_4_ = -(uint)(iVar14 < auVar21._4_4_);
        iVar39 = -(uint)(iVar39 < auVar21._8_4_);
        auVar37._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
        auVar28._4_4_ = iVar35;
        auVar28._0_4_ = iVar35;
        auVar28._8_4_ = iVar39;
        auVar28._12_4_ = iVar39;
        auVar33._4_4_ = -(uint)(auVar21._4_4_ == iVar14);
        auVar33._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        auVar21 = auVar33 & auVar28 | auVar37;
        auVar21 = packssdw(auVar21,auVar21);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(&pKVar6[4].field_0x0 + lVar9) = sVar8 + 0xc;
        }
        auVar21 = pshufhw(auVar28,auVar28,0x84);
        auVar22 = pshufhw(auVar33,auVar33,0x84);
        auVar24 = pshufhw(auVar21,auVar37,0x84);
        auVar29._8_4_ = 0xffffffff;
        auVar29._0_8_ = 0xffffffffffffffff;
        auVar29._12_4_ = 0xffffffff;
        auVar29 = (auVar24 | auVar22 & auVar21) ^ auVar29;
        auVar21 = packssdw(auVar29,auVar29);
        if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(&pKVar6[4].field_0x2 + lVar9) = sVar8 + 0xe;
        }
        lVar17 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 8;
        auVar20._8_8_ = lVar17 + 8;
        lVar17 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 8;
        auVar19._8_8_ = lVar17 + 8;
        lVar17 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 8;
        auVar18._8_8_ = lVar17 + 8;
        lVar17 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 8;
        auVar16._8_8_ = lVar17 + 8;
        lVar9 = lVar9 + 0x10;
      } while ((ulong)(nVars + 7U >> 3) << 4 != lVar9);
    }
    puVar7 = (undefined1 *)0x0;
    if (((uint)*pKVar6 & 0x1c0) == 0x140) {
      puVar7 = &pKVar6[1].field_0x0 + ((uint)*pKVar6 >> 8 & 0x3fc);
    }
    uVar11 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar11 = 1;
    }
    if (0 < (int)uVar11) {
      uVar10 = (ulong)uVar11 + 1;
      do {
        *(uint *)(puVar7 + uVar10 * 4 + -8) = pTruth[uVar10 - 2];
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    uVar11 = Kit_TruthSupport(pTruth,nVars);
    uVar12 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
    uVar12 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
    uVar12 = (uVar12 >> 4 & 0x7070707) + (uVar12 & 0x7070707);
    uVar12 = (uVar12 >> 8 & 0xf000f) + (uVar12 & 0xf000f);
    iVar35 = (uVar12 >> 0x10) + (uVar12 & 0xffff);
    if (iVar35 == 1) {
      *pKVar6 = (Kit_DsdObj_t)((uint)*pKVar6 & 0x3fffe3f | 0x4000080);
      sVar8 = 0;
      uVar12 = 0;
      while ((uVar11 >> (uVar12 & 0x1f) & 1) == 0) {
        uVar12 = uVar12 + 1;
        sVar8 = sVar8 + -2;
        if (uVar12 == 0x20) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
      }
      *(ushort *)(pKVar6 + 1) = ((ushort)*pTruth & 1) - sVar8;
    }
    else {
      pPar = &pNtk->Root;
      if (iVar35 == 0) {
        *pKVar6 = (Kit_DsdObj_t)((uint)*pKVar6 & 0x3fffe3f | 0x40);
        if (*pTruth == 0) {
          *(byte *)pPar = (byte)*pPar ^ 1;
        }
      }
      else {
        Kit_DsdDecompose_rec(pNtk,*ppKVar2,uVar11,pPar,nDecMux);
      }
    }
    return pNtk;
  }
  __assert_fail("pNtk->pNodes[0] == pObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x8e6,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
}

Assistant:

Kit_DsdNtk_t * Kit_DsdDecomposeInt( unsigned * pTruth, int nVars, int nDecMux )
{
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uSupp;
    int i, nVarsReal;
    assert( nVars <= 16 );
    pNtk = Kit_DsdNtkAlloc( nVars );
    pNtk->Root = Abc_Var2Lit( pNtk->nVars, 0 );
    // create the first node
    pObj = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, nVars );
    assert( pNtk->pNodes[0] == pObj );
    for ( i = 0; i < nVars; i++ )
       pObj->pFans[i] = Abc_Var2Lit( i, 0 );
    Kit_TruthCopy( Kit_DsdObjTruth(pObj), pTruth, nVars );
    uSupp = Kit_TruthSupport( pTruth, nVars );
    // consider special cases
    nVarsReal = Kit_WordCountOnes( uSupp );
    if ( nVarsReal == 0 )
    {
        pObj->Type = KIT_DSD_CONST1;
        pObj->nFans = 0;
        if ( pTruth[0] == 0 )
             pNtk->Root = Abc_LitNot(pNtk->Root);
        return pNtk;
    }
    if ( nVarsReal == 1 )
    {
        pObj->Type = KIT_DSD_VAR;
        pObj->nFans = 1;
        pObj->pFans[0] = Abc_Var2Lit( Kit_WordFindFirstBit(uSupp), (pTruth[0] & 1) );
        return pNtk;
    }
    Kit_DsdDecompose_rec( pNtk, pNtk->pNodes[0], uSupp, &pNtk->Root, nDecMux );
    return pNtk;
}